

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

void __thiscall HullLibrary::removeb2b(HullLibrary *this,cbtHullTriangle *s,cbtHullTriangle *t)

{
  b2bfix(this,s,t);
  *(undefined8 *)(*(long *)(this + 0x10) + (long)s->id * 8) = 0;
  cbtAlignedFreeInternal(s);
  *(undefined8 *)(*(long *)(this + 0x10) + (long)t->id * 8) = 0;
  cbtAlignedFreeInternal(t);
  return;
}

Assistant:

void HullLibrary::removeb2b(cbtHullTriangle *s, cbtHullTriangle *t)
{
	b2bfix(s, t);
	deAllocateTriangle(s);

	deAllocateTriangle(t);
}